

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_namelist.cc
# Opt level: O2

NameListType * ctemplate::TemplateNamelist::GetList_abi_cxx11_(void)

{
  if (namelist__abi_cxx11_ == (NameListType *)0x0) {
    namelist__abi_cxx11_ = (NameListType *)operator_new(0x38);
    (namelist__abi_cxx11_->_M_h)._M_buckets = &(namelist__abi_cxx11_->_M_h)._M_single_bucket;
    (namelist__abi_cxx11_->_M_h)._M_bucket_count = 1;
    (namelist__abi_cxx11_->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (namelist__abi_cxx11_->_M_h)._M_element_count = 0;
    (namelist__abi_cxx11_->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
    (namelist__abi_cxx11_->_M_h)._M_rehash_policy._M_next_resize = 0;
    (namelist__abi_cxx11_->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  }
  return namelist__abi_cxx11_;
}

Assistant:

const TemplateNamelist::NameListType& TemplateNamelist::GetList() {
  if ( !namelist_ ) {
    namelist_ = new NameListType;
  }
  return *namelist_;
}